

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.cpp
# Opt level: O3

void pstore::assert_failed(czstring str,czstring file,int line)

{
  int iVar1;
  size_t sVar2;
  long *plVar3;
  array<void_*,_64UL> callstack;
  __uniq_ptr_impl<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
  local_250;
  char *local_248 [2];
  undefined8 *local_238;
  char *local_230;
  undefined1 local_228 [512];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Assert failed: (",0x10);
  if (str == (czstring)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1162b0);
  }
  else {
    sVar2 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,str,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"), file ",8);
  if (file == (czstring)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1162b0);
  }
  else {
    sVar2 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,file,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", line ",7);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,line);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar1 = backtrace(local_228,0x40);
  local_250._M_t.
  super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
  .super__Head_base<0UL,_char_**,_false>._M_head_impl =
       (tuple<char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
        )backtrace_symbols(local_228,iVar1);
  local_238 = &std::cerr;
  local_230 = "\n";
  std::copy<char**,std::ostream_iterator<char_const*,char,std::char_traits<char>>>
            (local_248,
             (char **)local_250._M_t.
                      super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                      .super__Head_base<0UL,_char_**,_false>._M_head_impl,
             (ostream_iterator<const_char_*,_char,_std::char_traits<char>_> *)
             ((long)local_250._M_t.
                    super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                    .super__Head_base<0UL,_char_**,_false>._M_head_impl + (long)iVar1 * 8));
  std::
  unique_ptr<char_*,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/support/assert.cpp:55:34)>
  ::~unique_ptr((unique_ptr<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                 *)&local_250);
  abort();
}

Assistant:

void assert_failed (gsl::czstring const str, gsl::czstring const file, int const line) {
#    ifdef _WIN32
        auto & out_stream = std::wcerr;
#    else
        auto & out_stream = std::cerr;
#    endif
        out_stream << PSTORE_NATIVE_TEXT ("Assert failed: (") << str
                   << PSTORE_NATIVE_TEXT ("), file ") << file << PSTORE_NATIVE_TEXT (", line ")
                   << line << std::endl;
#    if PSTORE_HAVE_BACKTRACE
        {
            std::array<void *, 64U> callstack;
            void ** const out = callstack.data ();
            int const frames = ::backtrace (out, static_cast<int> (callstack.size ()));

            auto const deleter = [] (void * const p) {
                if (p != nullptr) {
                    // NOLINTNEXTLINE(cppcoreguidelines-no-malloc, hicpp-no-malloc)
                    std::free (p);
                }
            };
            std::unique_ptr<gsl::zstring, decltype (deleter)> const strs{
                ::backtrace_symbols (out, frames), deleter};
            auto * const begin = strs.get ();
            std::copy (
                begin, begin + frames,
                std::ostream_iterator<gsl::czstring> (out_stream, PSTORE_NATIVE_TEXT ("\n")));
        }
#    endif // PSTORE_HAVE_BACKTRACE
        std::abort ();
    }